

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  Type *pTVar5;
  Result *_result;
  long lVar6;
  long lVar7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_002aeef1:
    Result::Result(__return_storage_ptr__);
  }
  else {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    uVar1 = pTVar5->rank_;
    lVar7 = (long)(int)uVar1;
    std::operator+(&local_40,
                   "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_40,"\' layer.");
    std::__cxx11::string::~string((string *)&local_40);
    uVar2 = layer->_oneof_case_[0];
    if (uVar2 == 0x4e2) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while ((SBORROW8(lVar3,-lVar7) == lVar3 + lVar7 < 0) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4e7) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while ((SBORROW8(lVar3,-lVar7) == lVar3 + lVar7 < 0) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4ec) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while ((SBORROW8(lVar3,-lVar7) == lVar3 + lVar7 < 0) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4f1) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while ((SBORROW8(lVar3,-lVar7) == lVar3 + lVar7 < 0) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4f6) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4fb) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x500) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x505) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x50a) {
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      if (uVar2 != 0x50f) {
LAB_002aeee7:
        std::__cxx11::string::~string((string *)&err);
        goto LAB_002aeef1;
      }
      lVar6 = 0;
      do {
        if ((long)(((layer->layer_).convolution_)->kernelsize_).current_size_ * 8 == lVar6)
        goto LAB_002aeee7;
        lVar3 = *(long *)((long)(((layer->layer_).convolution_)->kernelsize_).arena_or_elements_ +
                         lVar6);
      } while (((int)-uVar1 <= lVar3) && (lVar6 = lVar6 + 8, lVar3 < lVar7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    std::__cxx11::string::~string((string *)&err);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return Result();
}